

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void __thiscall SimpleString::SimpleString(SimpleString *this,char *other,size_t repeatCount)

{
  char *result;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  sVar3 = 1 - repeatCount;
  lVar5 = -1;
  do {
    sVar3 = sVar3 + repeatCount;
    lVar4 = lVar5 + 1;
    lVar5 = lVar5 + 1;
  } while (other[lVar4] != '\0');
  setInternalBufferToNewBuffer(this,sVar3);
  pcVar1 = this->buffer_;
  if (repeatCount != 0) {
    pcVar2 = pcVar1 + 1;
    sVar3 = 0;
    do {
      if (pcVar1 != (char *)0x0 && lVar5 != -1) {
        *pcVar1 = *other;
        if (lVar5 != 0) {
          lVar4 = 0;
          do {
            if (pcVar2[lVar4 + -1] == '\0') break;
            pcVar2[lVar4] = other[lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (lVar5 != lVar4);
        }
      }
      pcVar1 = pcVar1 + lVar5;
      sVar3 = sVar3 + 1;
      pcVar2 = pcVar2 + lVar5;
    } while (sVar3 != repeatCount);
  }
  *pcVar1 = '\0';
  return;
}

Assistant:

SimpleString::SimpleString(const char *other, size_t repeatCount)
    : buffer_(NULLPTR), bufferSize_(0)
{
    size_t otherStringLength = StrLen(other);
    setInternalBufferToNewBuffer(otherStringLength * repeatCount + 1);

    char* next = buffer_;
    for (size_t i = 0; i < repeatCount; i++) {
        StrNCpy(next, other, otherStringLength + 1);
        next += otherStringLength;
    }
    *next = 0;
}